

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall
TypeTest_CanonicalizeDescriptors_Test::TestBody(TypeTest_CanonicalizeDescriptors_Test *this)

{
  undefined8 uVar1;
  HeapType HVar2;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  Struct *pSVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  ulong uVar5;
  undefined1 local_88 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_68;
  byte local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  TypeBuilder local_38;
  TypeBuilder builder;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_38,0xc);
  uVar5 = 0;
  do {
    ::wasm::TypeBuilder::createRecGroup((ulong)&local_38,uVar5);
    uVar5 = uVar5 + 4;
  } while (uVar5 != 0xc);
  pSVar3 = (Struct *)0x0;
  do {
    local_68._0_8_ = (void *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    ::wasm::TypeBuilder::setHeapType((ulong)&local_38,pSVar3);
    if ((void *)local_68._0_8_ != (void *)0x0) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
    }
    pSVar3 = (Struct *)
             ((long)&(pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1);
  } while (pSVar3 != (Struct *)0xc);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescriptor(&local_38,0,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescribed(&local_38,1,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescriptor(&local_38,2,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescribed(&local_38,3,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescriptor(&local_38,4,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescriptor(&local_38,5,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescribed(&local_38,6,uVar1,1);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setDescribed(&local_38,7,uVar1,1);
  local_68._8_8_ = 8;
  local_68._0_8_ = &local_38;
  HVar2.id = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            ((Entry *)&local_68._M_first,HVar2,&local_38);
  local_68._8_8_ = 9;
  local_68._0_8_ = &local_38;
  HVar2.id = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            ((Entry *)&local_68._M_first,HVar2,&local_38);
  local_68._8_8_ = 10;
  local_68._0_8_ = &local_38;
  HVar2.id = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            ((Entry *)&local_68._M_first,HVar2,&local_38);
  local_68._8_8_ = 0xb;
  local_68._0_8_ = &local_38;
  HVar2.id = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeDescriptors_Test::TestBody()::__0>
            ((Entry *)&local_68._M_first,HVar2,&local_38);
  ::wasm::TypeBuilder::build();
  local_48[0] = (internal)(local_50 == 0);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_48[0]) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&local_68._M_first);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88,__x);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              (local_48,"built[0]","built[8]",(HeapType *)local_88,
               (HeapType *)((long)local_88 + 0x40));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x242,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              (local_48,"built[1]","built[9]",(HeapType *)((long)local_88 + 8),
               (HeapType *)((long)local_88 + 0x48));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x243,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              (local_48,"built[2]","built[10]",(HeapType *)((long)local_88 + 0x10),
               (HeapType *)((long)local_88 + 0x50));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x244,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              (local_48,"built[3]","built[11]",(HeapType *)((long)local_88 + 0x18),
               (HeapType *)((long)local_88 + 0x58));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x245,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    local_28._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::wasm::HeapType::getRecGroup();
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getRecGroup();
    testing::internal::CmpHelperNE<wasm::RecGroup,wasm::RecGroup>
              (local_48,"built[0].getRecGroup()","built[4].getRecGroup()",(RecGroup *)&local_28,
               (RecGroup *)&builder);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x247,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_88);
    }
  }
  else {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,local_48,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&builder,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x23f,(char *)local_88);
    testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
    if (local_88 !=
        (undefined1  [8])
        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)local_88,
                      (ulong)((long)&(built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_50]._M_data)
            ((anon_class_1_0_00000001 *)local_88,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_68._M_first);
  ::wasm::TypeBuilder::~TypeBuilder(&local_38);
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeDescriptors) {
  constexpr int numGroups = 3;
  constexpr int groupSize = 4;
  TypeBuilder builder(numGroups * groupSize);

  for (int i = 0; i < numGroups; ++i) {
    builder.createRecGroup(i * groupSize, groupSize);
  }
  for (int i = 0; i < numGroups * groupSize; ++i) {
    builder[i] = Struct();
  }

  // A B A' B'
  builder[0].descriptor(builder[1]);
  builder[1].describes(builder[0]);
  builder[2].descriptor(builder[3]);
  builder[3].describes(builder[2]);

  // A' A B B'
  builder[4].descriptor(builder[7]);
  builder[5].descriptor(builder[6]);
  builder[6].describes(builder[5]);
  builder[7].describes(builder[4]);

  auto translate = [&](HeapType t) -> HeapType {
    for (int i = 0; i < groupSize; ++i) {
      if (t == builder[i]) {
        return builder[2 * groupSize + i];
      }
    }
    WASM_UNREACHABLE("unexpected type");
  };

  // A B A' B' again
  builder[8].copy(builder[0], translate);
  builder[9].copy(builder[1], translate);
  builder[10].copy(builder[2], translate);
  builder[11].copy(builder[3], translate);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], built[8]);
  EXPECT_EQ(built[1], built[9]);
  EXPECT_EQ(built[2], built[10]);
  EXPECT_EQ(built[3], built[11]);

  EXPECT_NE(built[0].getRecGroup(), built[4].getRecGroup());
}